

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGIsCompilable(xmlRelaxNGDefinePtr_conflict def)

{
  int iVar1;
  ushort uVar2;
  xmlRelaxNGDefinePtr pxVar3;
  
  iVar1 = -1;
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return -1;
  }
  uVar2 = def->dflags;
  if (def->type == XML_RELAXNG_ELEMENT) {
    if (((uVar2 & 0xc0) == 0) && (pxVar3 = def->content, pxVar3 != (xmlRelaxNGDefinePtr)0x0)) {
      do {
        iVar1 = xmlRelaxNGIsCompilable(pxVar3);
        if (iVar1 != 1) {
          if (iVar1 != 0) goto LAB_0018788d;
          uVar2 = def->dflags & 0xff3fU | 0x80;
          goto LAB_00187928;
        }
        pxVar3 = pxVar3->next;
      } while (pxVar3 != (xmlRelaxNGDefinePtr)0x0);
      uVar2 = (ushort)(byte)((byte)def->dflags >> 7) * 0x40 + 0x40;
LAB_00187928:
      def->dflags = uVar2;
    }
LAB_0018788d:
    if (def->nameClass != (xmlRelaxNGDefinePtr)0x0) {
      return 0;
    }
    return (uint)(def->name != (xmlChar *)0x0);
  }
  if ((uVar2 & 0x40) != 0) goto LAB_001879a6;
  if ((char)uVar2 < '\0') goto LAB_001878db;
  switch(def->type) {
  case XML_RELAXNG_EMPTY:
  case XML_RELAXNG_TEXT:
    goto switchD_001878cf_caseD_0;
  default:
    break;
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_OPTIONAL:
  case XML_RELAXNG_ZEROORMORE:
  case XML_RELAXNG_ONEORMORE:
  case XML_RELAXNG_CHOICE:
  case XML_RELAXNG_GROUP:
  case XML_RELAXNG_START:
    pxVar3 = def->content;
    if (pxVar3 == (xmlRelaxNGDefinePtr)0x0) {
      return -1;
    }
    do {
      iVar1 = xmlRelaxNGIsCompilable(pxVar3);
      if (iVar1 != 1) goto LAB_00187989;
      pxVar3 = pxVar3->next;
    } while (pxVar3 != (xmlRelaxNGDefinePtr)0x0);
    goto LAB_0018799b;
  case XML_RELAXNG_REF:
  case XML_RELAXNG_EXTERNALREF:
  case XML_RELAXNG_PARENTREF:
    if (def->depth == -0x14) goto LAB_001879a6;
    def->depth = -0x14;
    pxVar3 = def->content;
    if (pxVar3 == (xmlRelaxNGDefinePtr)0x0) {
      return -1;
    }
    do {
      iVar1 = xmlRelaxNGIsCompilable(pxVar3);
      if (iVar1 != 1) goto LAB_00187989;
      pxVar3 = pxVar3->next;
    } while (pxVar3 != (xmlRelaxNGDefinePtr)0x0);
LAB_0018799b:
    uVar2 = def->dflags;
switchD_001878cf_caseD_0:
    def->dflags = uVar2 | 0x40;
LAB_001879a6:
    iVar1 = 1;
    break;
  case XML_RELAXNG_NOOP:
    iVar1 = xmlRelaxNGIsCompilable(def->content);
LAB_00187989:
    if (iVar1 == 1) goto LAB_0018799b;
    if (iVar1 != 0) {
      return iVar1;
    }
    uVar2 = def->dflags;
  case XML_RELAXNG_NOT_ALLOWED:
  case XML_RELAXNG_EXCEPT:
  case XML_RELAXNG_DATATYPE:
  case XML_RELAXNG_PARAM:
  case XML_RELAXNG_VALUE:
  case XML_RELAXNG_LIST:
  case XML_RELAXNG_ATTRIBUTE:
  case XML_RELAXNG_INTERLEAVE:
    def->dflags = uVar2 | 0x80;
LAB_001878db:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
xmlRelaxNGIsCompilable(xmlRelaxNGDefinePtr def)
{
    int ret = -1;

    if (def == NULL) {
        return (-1);
    }
    if ((def->type != XML_RELAXNG_ELEMENT) &&
        (def->dflags & IS_COMPILABLE))
        return (1);
    if ((def->type != XML_RELAXNG_ELEMENT) &&
        (def->dflags & IS_NOT_COMPILABLE))
        return (0);
    switch (def->type) {
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGIsCompilable(def->content);
            break;
        case XML_RELAXNG_TEXT:
        case XML_RELAXNG_EMPTY:
            ret = 1;
            break;
        case XML_RELAXNG_ELEMENT:
            /*
             * Check if the element content is compilable
             */
            if (((def->dflags & IS_NOT_COMPILABLE) == 0) &&
                ((def->dflags & IS_COMPILABLE) == 0)) {
                xmlRelaxNGDefinePtr list;

                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
		/*
		 * Because the routine is recursive, we must guard against
		 * discovering both COMPILABLE and NOT_COMPILABLE
		 */
                if (ret == 0) {
		    def->dflags &= ~IS_COMPILABLE;
                    def->dflags |= IS_NOT_COMPILABLE;
		}
                if ((ret == 1) && !(def->dflags &= IS_NOT_COMPILABLE))
                    def->dflags |= IS_COMPILABLE;
            }
            /*
             * All elements return a compilable status unless they
             * are generic like anyName
             */
            if ((def->nameClass != NULL) || (def->name == NULL))
                ret = 0;
            else
                ret = 1;
            return (ret);
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
            if (def->depth == -20) {
                return (1);
            } else {
                xmlRelaxNGDefinePtr list;

                def->depth = -20;
                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
            }
            break;
        case XML_RELAXNG_START:
        case XML_RELAXNG_OPTIONAL:
        case XML_RELAXNG_ZEROORMORE:
        case XML_RELAXNG_ONEORMORE:
        case XML_RELAXNG_CHOICE:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:{
                xmlRelaxNGDefinePtr list;

                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_NOT_ALLOWED:
            ret = 0;
            break;
    }
    if (ret == 0)
        def->dflags |= IS_NOT_COMPILABLE;
    if (ret == 1)
        def->dflags |= IS_COMPILABLE;
    return (ret);
}